

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

_Bool config_find_double(ConfigScanner *sc,char *section,char *name,double *result)

{
  _Bool _Var1;
  ConfigItem *pCVar2;
  ItemValue IVar3;
  
  pCVar2 = config_find(sc,section,name);
  if (pCVar2 == (ConfigItem *)0x0) {
LAB_001431ad:
    _Var1 = false;
  }
  else {
    if (pCVar2->vtype == VTYPE_INTEGER) {
      IVar3.v_double = (double)(pCVar2->value).v_integer;
    }
    else {
      if (pCVar2->vtype != VTYPE_DOUBLE) goto LAB_001431ad;
      IVar3 = pCVar2->value;
    }
    *result = (double)IVar3;
    _Var1 = true;
  }
  return _Var1;
}

Assistant:

bool config_find_double(ConfigScanner *sc, const char *section, char *name, double *result)
{
	ConfigItem *temp = config_find(sc, section, name);
	if (temp == NULL)
	{
		return false;
	}
	if (temp->vtype == VTYPE_DOUBLE)
	{
		*result = temp->value.v_double;
		return true;
	}
	else if (temp->vtype == VTYPE_INTEGER)
	{
		*result = (double)temp->value.v_integer;
		return true;
	}
	return false;
}